

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall pegmatite::Context::restore(Context *this,ParsingState *st)

{
  int iVar1;
  ParsingState *st_local;
  Context *this_local;
  
  (this->position).it.buffer = (st->position).it.buffer;
  (this->position).it.idx = (st->position).it.idx;
  iVar1 = (st->position).col;
  (this->position).line = (st->position).line;
  (this->position).col = iVar1;
  std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
  ::resize(&this->matches,st->matches);
  return;
}

Assistant:

void restore(const ParsingState &st)
	{
		position = st.position;
		matches.resize(st.matches);
	}